

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object3D.h
# Opt level: O3

void __thiscall Sphere::~Sphere(Sphere *this)

{
  pointer pcVar1;
  
  (this->super_Object3D)._vptr_Object3D = (_func_int **)&PTR__Object3D_0013f990;
  pcVar1 = (this->super_Object3D).type._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_Object3D).type.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

virtual ~Sphere() {}